

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

void ssl_tls_trace(int direction,int ssl_ver,int content_type,void *buf,size_t len,SSL *ssl,
                  void *userp)

{
  Curl_easy *data;
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int ssl_ver_00;
  ulong uVar6;
  char unknown [32];
  char ssl_buf [1024];
  
  if (userp == (void *)0x0) {
    return;
  }
  data = *userp;
  if (data == (Curl_easy *)0x0) {
    return;
  }
  if ((data->set).fdebug == (curl_debug_callback)0x0) {
    return;
  }
  if (1 < (uint)direction) {
    return;
  }
  switch(ssl_ver) {
  case 0x300:
    pcVar2 = "SSLv3";
    break;
  case 0x301:
    pcVar2 = "TLSv1.0";
    break;
  case 0x302:
    pcVar2 = "TLSv1.1";
    break;
  case 0x303:
    pcVar2 = "TLSv1.2";
    break;
  case 0x304:
    pcVar2 = "TLSv1.3";
    break;
  default:
    if (ssl_ver == 0) goto LAB_0044f02d;
    if (ssl_ver != 2) {
      curl_msnprintf(unknown,0x20,"(%x)",(ulong)(uint)ssl_ver);
      pcVar2 = unknown;
      break;
    }
    pcVar4 = "";
    pcVar2 = "SSLv2";
    ssl_ver_00 = 0;
    goto LAB_0044ef70;
  }
  ssl_ver_00 = ssl_ver >> 8;
  if (content_type == 0 || ssl_ver_00 != 3) {
    pcVar4 = "";
  }
  else {
    uVar1 = content_type;
    if ((len != 0 && buf != (void *)0x0) && content_type == 0x101) {
      uVar1 = (uint)*buf;
    }
    ssl_ver_00 = 3;
    switch(uVar1) {
    case 0x14:
      pcVar4 = "TLS change cipher";
      break;
    case 0x15:
      pcVar4 = "TLS alert";
      break;
    case 0x16:
      pcVar4 = "TLS handshake";
      break;
    case 0x17:
      pcVar4 = "TLS app data";
      break;
    default:
      if (uVar1 == 0x100) {
        pcVar4 = "TLS header";
      }
      else {
        pcVar4 = "TLS Unknown";
      }
    }
  }
LAB_0044ef70:
  if (content_type == 0x101) {
    uVar6 = 0;
    pcVar5 = "[no content]";
  }
  else {
    if (content_type == 0x15) {
      uVar1 = (int)*(char *)((long)buf + 1) + *buf * 0x100;
      pcVar5 = SSL_alert_desc_string_long(uVar1);
    }
    else {
      if (content_type == 0x14) {
        uVar6 = (ulong)(uint)(int)*buf;
        pcVar5 = "Change cipher spec";
        goto LAB_0044efe1;
      }
      uVar1 = (uint)*buf;
      pcVar5 = ssl_msg_type(ssl_ver_00,uVar1);
    }
    uVar6 = (ulong)uVar1;
  }
LAB_0044efe1:
  pcVar3 = "OUT";
  if (direction == 0) {
    pcVar3 = "IN";
  }
  uVar1 = curl_msnprintf(ssl_buf,0x400,"%s (%s), %s, %s (%d):\n",pcVar2,pcVar3,pcVar4,pcVar5,uVar6);
  if (uVar1 < 0x400) {
    Curl_debug(data,CURLINFO_TEXT,ssl_buf,(ulong)uVar1);
  }
LAB_0044f02d:
  Curl_debug(data,(direction == 1) + CURLINFO_SSL_DATA_IN,(char *)buf,len);
  return;
}

Assistant:

static void ssl_tls_trace(int direction, int ssl_ver, int content_type,
                          const void *buf, size_t len, SSL *ssl,
                          void *userp)
{
  struct Curl_easy *data;
  char unknown[32];
  const char *verstr = NULL;
  struct connectdata *conn = userp;

  if(!conn || !conn->data || !conn->data->set.fdebug ||
     (direction != 0 && direction != 1))
    return;

  data = conn->data;

  switch(ssl_ver) {
#ifdef SSL2_VERSION /* removed in recent versions */
  case SSL2_VERSION:
    verstr = "SSLv2";
    break;
#endif
#ifdef SSL3_VERSION
  case SSL3_VERSION:
    verstr = "SSLv3";
    break;
#endif
  case TLS1_VERSION:
    verstr = "TLSv1.0";
    break;
#ifdef TLS1_1_VERSION
  case TLS1_1_VERSION:
    verstr = "TLSv1.1";
    break;
#endif
#ifdef TLS1_2_VERSION
  case TLS1_2_VERSION:
    verstr = "TLSv1.2";
    break;
#endif
#ifdef TLS1_3_VERSION
  case TLS1_3_VERSION:
    verstr = "TLSv1.3";
    break;
#endif
  case 0:
    break;
  default:
    snprintf(unknown, sizeof(unknown), "(%x)", ssl_ver);
    verstr = unknown;
    break;
  }

  if(ssl_ver) {
    const char *msg_name, *tls_rt_name;
    char ssl_buf[1024];
    int msg_type, txt_len;

    /* the info given when the version is zero is not that useful for us */

    ssl_ver >>= 8; /* check the upper 8 bits only below */

    /* SSLv2 doesn't seem to have TLS record-type headers, so OpenSSL
     * always pass-up content-type as 0. But the interesting message-type
     * is at 'buf[0]'.
     */
    if(ssl_ver == SSL3_VERSION_MAJOR && content_type)
      tls_rt_name = tls_rt_type(content_type, buf, len);
    else
      tls_rt_name = "";

#ifdef SSL3_RT_INNER_CONTENT_TYPE
    if(content_type == SSL3_RT_INNER_CONTENT_TYPE) {
      msg_type = 0;
      msg_name = "[no content]";
    }
    else
#endif
    if(content_type == SSL3_RT_CHANGE_CIPHER_SPEC) {
      msg_type = *(char *)buf;
      msg_name = "Change cipher spec";
    }
    else if(content_type == SSL3_RT_ALERT) {
      msg_type = (((char *)buf)[0] << 8) + ((char *)buf)[1];
      msg_name = SSL_alert_desc_string_long(msg_type);
    }
    else {
      msg_type = *(char *)buf;
      msg_name = ssl_msg_type(ssl_ver, msg_type);
    }

    txt_len = snprintf(ssl_buf, sizeof(ssl_buf), "%s (%s), %s, %s (%d):\n",
                       verstr, direction?"OUT":"IN",
                       tls_rt_name, msg_name, msg_type);
    if(0 <= txt_len && (unsigned)txt_len < sizeof(ssl_buf)) {
      Curl_debug(data, CURLINFO_TEXT, ssl_buf, (size_t)txt_len);
    }
  }

  Curl_debug(data, (direction == 1) ? CURLINFO_SSL_DATA_OUT :
             CURLINFO_SSL_DATA_IN, (char *)buf, len);
  (void) ssl;
}